

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

Half deqp::gls::anon_unknown_1::getRandom<deqp::gls::(anonymous_namespace)::GLValue::Half>
               (deRandom *rnd,Half min,Half max)

{
  bool bVar1;
  Half HVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Half local_1c;
  Half local_1a;
  
  local_1c.m_value = max.m_value;
  local_1a.m_value = min.m_value;
  bVar1 = GLValue::Half::operator<(&local_1c,&local_1a);
  if (bVar1) {
    return (Half)min.m_value;
  }
  fVar3 = GLValue::Half::halfToFloat(max.m_value);
  fVar4 = GLValue::Half::halfToFloat(min.m_value);
  fVar5 = deRandom_getFloat(rnd);
  HVar2 = GLValue::Half::create(fVar5 * (fVar3 - fVar4) + fVar4);
  return (Half)HVar2.m_value;
}

Assistant:

inline GLValue::Half getRandom (deRandom& rnd, GLValue::Half min, GLValue::Half max)
{
	if (max < min)
		return min;

	float fMax = max.to<float>();
	float fMin = min.to<float>();
	GLValue::Half h = GLValue::Half::create(fMin + deRandom_getFloat(&rnd) * (fMax - fMin));
	return h;
}